

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::
Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
::UseKeyAndValueFromEntry
          (Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
           *this)

{
  ValueUnion VVar1;
  uint32 uVar2;
  int iVar3;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  *pMVar4;
  Arena *this_00;
  CustomLayerParams_CustomLayerParamValue *pCVar5;
  CustomLayerParams_CustomLayerParamValue *this_01;
  
  pMVar4 = (this->entry_).ptr_;
  if (pMVar4 != (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                 *)0x0) {
    (*(pMVar4->super_MessageLite)._vptr_MessageLite[0x11])();
    std::__cxx11::string::_M_assign((string *)&this->key_);
    pCVar5 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
             ::operator[](this->map_,&this->key_);
    this->value_ptr_ = pCVar5;
    pMVar4 = (this->entry_).ptr_;
    if (pMVar4 != (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                   *)0x0) {
      *(byte *)pMVar4->_has_bits_ = (byte)pMVar4->_has_bits_[0] | 2;
      this_01 = pMVar4->value_;
      if (this_01 == (CustomLayerParams_CustomLayerParamValue *)0x0) {
        this_00 = pMVar4->arena_;
        if (this_00 == (Arena *)0x0) {
          this_01 = (CustomLayerParams_CustomLayerParamValue *)operator_new(0x20);
          CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
          CustomLayerParams_CustomLayerParamValue(this_01);
        }
        else {
          this_01 = (CustomLayerParams_CustomLayerParamValue *)
                    Arena::AllocateAligned
                              (this_00,(type_info *)
                                       &CoreML::Specification::
                                        CustomLayerParams_CustomLayerParamValue::typeinfo,0x20);
          CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
          CustomLayerParams_CustomLayerParamValue(this_01);
          Arena::AddListNode(this_00,this_01,
                             arena_destruct_object<CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
                            );
        }
        pMVar4->value_ = this_01;
        pCVar5 = this->value_ptr_;
      }
      if (this_01 != pCVar5) {
        VVar1 = pCVar5->value_;
        pCVar5->value_ = this_01->value_;
        this_01->value_ = VVar1;
        uVar2 = pCVar5->_oneof_case_[0];
        pCVar5->_oneof_case_[0] = this_01->_oneof_case_[0];
        this_01->_oneof_case_[0] = uVar2;
        iVar3 = pCVar5->_cached_size_;
        pCVar5->_cached_size_ = this_01->_cached_size_;
        this_01->_cached_size_ = iVar3;
      }
      return;
    }
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::internal::MapEntryImpl<google::protobuf::internal::MapEntryLite<std::basic_string<char>, CoreML::Specification::CustomLayerParams_CustomLayerParamValue, google::protobuf::internal::WireFormatLite::TYPE_STRING, google::protobuf::internal::WireFormatLite::TYPE_MESSAGE, 0>, google::protobuf::MessageLite, std::basic_string<char>, CoreML::Specification::CustomLayerParams_CustomLayerParamValue, google::protobuf::internal::WireFormatLite::TYPE_STRING, google::protobuf::internal::WireFormatLite::TYPE_MESSAGE, 0>>::operator->() const [C = google::protobuf::internal::MapEntryImpl<google::protobuf::internal::MapEntryLite<std::basic_string<char>, CoreML::Specification::CustomLayerParams_CustomLayerParamValue, google::protobuf::internal::WireFormatLite::TYPE_STRING, google::protobuf::internal::WireFormatLite::TYPE_MESSAGE, 0>, google::protobuf::MessageLite, std::basic_string<char>, CoreML::Specification::CustomLayerParams_CustomLayerParamValue, google::protobuf::internal::WireFormatLite::TYPE_STRING, google::protobuf::internal::WireFormatLite::TYPE_MESSAGE, 0>]"
               );
}

Assistant:

void UseKeyAndValueFromEntry() GOOGLE_ATTRIBUTE_COLD {
      // Update key_ in case we need it later (because key() is called).
      // This is potentially inefficient, especially if the key is
      // expensive to copy (e.g., a long string), but this is a cold
      // path, so it's not a big deal.
      key_ = entry_->key();
      value_ptr_ = &(*map_)[key_];
      MoveHelper<ValueTypeHandler::kIsEnum,
                 ValueTypeHandler::kIsMessage,
                 ValueTypeHandler::kWireType ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                 Value>::Move(entry_->mutable_value(), value_ptr_);
    }